

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O3

void draw_demo_menu(DEMO_MENU *menu)

{
  ALLEGRO_FONT *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int_DEMO_MENU_ptr_int_int *p_Var5;
  int iVar6;
  DEMO_MENU *pDVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  char *pcVar13;
  undefined4 uVar14;
  float fVar15;
  undefined8 uVar16;
  
  draw_background();
  draw_credits();
  iVar6 = screen_width / 2;
  iVar8 = screen_height / 6;
  iVar3 = al_get_font_line_height(demo_data[2].dat);
  iVar8 = iVar8 - iVar3 / 2;
  pAVar1 = (ALLEGRO_FONT *)demo_data[2].dat;
  uVar16 = 0x3e000000;
  pcVar13 = (char *)al_map_rgba_f(0x3e000000,0x3e000000,0x3e000000,0x3e800000);
  demo_textprintf_centre(pAVar1,iVar6 + 6,iVar8 + 5,0x1179c8,pcVar13,uVar16);
  pAVar1 = (ALLEGRO_FONT *)demo_data[2].dat;
  uVar16 = 0x3f800000;
  pcVar13 = (char *)al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
  demo_textprintf_centre(pAVar1,iVar6,iVar8,0x1179c8,pcVar13,uVar16);
  p_Var5 = menu->proc;
  if (p_Var5 == (_func_int_DEMO_MENU_ptr_int_int *)0x0) {
    iVar3 = (screen_height * 3) / 5 + -8;
    iVar8 = 0x10;
  }
  else {
    iVar3 = 0;
    pDVar7 = menu;
    do {
      iVar8 = (*p_Var5)(pDVar7,5,0);
      iVar3 = iVar3 + iVar8;
      p_Var5 = pDVar7[1].proc;
      pDVar7 = pDVar7 + 1;
    } while (p_Var5 != (_func_int_DEMO_MENU_ptr_int_int *)0x0);
    p_Var5 = menu->proc;
    iVar8 = iVar3 + 0x10;
    iVar3 = (screen_height * 3) / 5 - ((iVar3 - (iVar8 >> 0x1f)) + 0x10 >> 1);
    if (p_Var5 != (_func_int_DEMO_MENU_ptr_int_int *)0x0) {
      iVar6 = 0;
      pDVar7 = menu;
      do {
        iVar4 = (*p_Var5)(pDVar7,4,0);
        pDVar7->w = iVar4;
        iVar2 = screen_width;
        if (iVar6 < iVar4) {
          iVar6 = iVar4;
        }
        pDVar7->x = (screen_width - iVar4) / 2;
        p_Var5 = pDVar7[1].proc;
        pDVar7 = pDVar7 + 1;
      } while (p_Var5 != (_func_int_DEMO_MENU_ptr_int_int *)0x0);
      iVar6 = iVar6 + 0x10;
      goto LAB_0010e438;
    }
  }
  iVar6 = 0x10;
  iVar2 = screen_width;
LAB_0010e438:
  iVar4 = iVar2 / 3;
  if (iVar2 / 3 < iVar6) {
    iVar4 = iVar6;
  }
  if (iVar2 <= iVar4) {
    iVar4 = iVar2;
  }
  iVar6 = (iVar2 - iVar4) / 2;
  fVar9 = (float)iVar6;
  fVar10 = (float)iVar3;
  fVar11 = (float)(iVar6 + iVar4);
  uVar14 = 0x3e810625;
  uVar12 = al_map_rgba_f(0x3e6353f8,0x3e810625,0x3e8a3d71,0x3f19999a);
  fVar15 = fVar10;
  al_draw_filled_rectangle(fVar9,fVar10,fVar11,(float)(iVar8 + iVar3),uVar12,uVar14);
  uVar12 = al_map_rgb(0,0,0);
  al_draw_rectangle(fVar9,fVar10,fVar11,(float)(iVar8 + iVar3),uVar12,fVar15,0x3f800000);
  p_Var5 = menu->proc;
  if (p_Var5 != (_func_int_DEMO_MENU_ptr_int_int *)0x0) {
    iVar3 = iVar3 + 8;
    do {
      (*p_Var5)(menu,1,iVar3);
      menu->y = iVar3;
      iVar8 = (*menu->proc)(menu,5,0);
      menu->h = iVar8;
      iVar3 = iVar3 + iVar8;
      p_Var5 = menu[1].proc;
      menu = menu + 1;
    } while (p_Var5 != (_func_int_DEMO_MENU_ptr_int_int *)0x0);
  }
  return;
}

Assistant:

void draw_demo_menu(DEMO_MENU * menu)
{
   int i, x, y, h, w;
   int tmp;
   static char logo_text[] = "Demo Game";

   draw_background();
   draw_credits();

   x = screen_width / 2;
   y = 1 * screen_height / 6 - al_get_font_line_height(demo_font_logo) / 2;
   demo_textprintf_centre(demo_font_logo, x + 6, y + 5,
                        al_map_rgba_f(0.125, 0.125, 0.125, 0.25), logo_text);
   demo_textprintf_centre(demo_font_logo, x, y, al_map_rgb_f(1, 1, 1), logo_text);

   /* calculate height of the whole menu and the starting y coordinate */
   h = 0;
   for (i = 0, h = 0; menu[i].proc != NULL; i++) {
      h += menu[i].proc(&menu[i], DEMO_MENU_MSG_HEIGHT, 0);
   }
   h += 2 * 8;
   y = 3 * screen_height / 5 - h / 2;

   /* calculate the width of the whole menu */
   w = 0;
   for (i = 0; menu[i].proc != NULL; i++) {
      tmp = menu[i].proc(&menu[i], DEMO_MENU_MSG_WIDTH, 0);
      menu[i].w = tmp;
      menu[i].x = (screen_width - tmp) / 2;
      if (tmp > w) {
         w = tmp;
      }
   }
   w += 2 * 8;
   if (w < screen_width / 3) w =  screen_width / 3;
   if (w > screen_width) w = screen_width;
   x = (screen_width - w) / 2;

   /* draw menu background */
   al_draw_filled_rectangle(x, y, x + w, y + h,
      al_map_rgba_f(0.37 * 0.6, 0.42 * 0.6, 0.45 * 0.6, 0.6));
   al_draw_rectangle(x, y, x + w, y + h, al_map_rgb(0, 0, 0), 1);

   /* draw menu items */
   y += 8;
   for (i = 0; menu[i].proc != NULL; i++) {
      menu[i].proc(&menu[i], DEMO_MENU_MSG_DRAW, y);
      menu[i].y = y;
      tmp = menu[i].proc(&menu[i], DEMO_MENU_MSG_HEIGHT, 0);
      menu[i].h = tmp;
      y += tmp;
   }
}